

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

Var Js::JavascriptArray::ReverseHelper<unsigned_long>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              unsigned_long length,ScriptContext *scriptContext)

{
  Type *this;
  Recycler *recycler;
  SparseArraySegmentBase *pSVar1;
  InterruptPoller *pIVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  BOOL BVar6;
  int iVar7;
  uint32 startIndex;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 *puVar8;
  char16_t *pcVar9;
  uint32 limitIndex;
  SparseArraySegmentBase *this_00;
  uint64 index;
  SparseArraySegmentBase *ptr;
  uint32 limitIndex_00;
  uint64 index_00;
  uint uVar10;
  bool bVar11;
  undefined1 local_a0 [8];
  AutoDisableInterrupt failFastOnError;
  undefined1 local_88 [8];
  JsReentLock jsReentLock;
  Var lowerValue;
  ThrowTypeErrorOnFailureHelper h;
  Var upperValue;
  
  local_88 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_88)->noJsReentrancy;
  ((ThreadContext *)local_88)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_88,pArr);
  jsReentLock.m_savedNoJsReentrancy = false;
  jsReentLock._25_7_ = 0;
  h.m_functionName = (PCWSTR)0x0;
  limitIndex_00 = (uint32)length;
  limitIndex = (uint32)(length >> 1);
  lowerValue = scriptContext;
  if (pArr == (JavascriptArray *)0x0 && typedArrayBase == (TypedArrayBase *)0x0) {
    bVar4 = VarIsImpl<Js::TypedArrayBase>(obj);
    if (bVar4) {
      typedArrayBase = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(obj);
    }
    else {
      typedArrayBase = (TypedArrayBase *)0x0;
    }
    h.m_scriptContext = (ScriptContext *)anon_var_dwarf_6940e95;
  }
  else {
    pcVar9 = L"[TypedArray].prototype.reverse";
    if (typedArrayBase == (TypedArrayBase *)0x0) {
      pcVar9 = L"Array.prototype.reverse";
    }
    h.m_scriptContext = (ScriptContext *)pcVar9;
    if ((pArr != (JavascriptArray *)0x0) &&
       (bVar4 = HasAnyES5ArrayInPrototypeChain(pArr,false), !bVar4)) {
      if (length >> 0x20 == 0) {
        if (length < 2) goto LAB_00a5b0ad;
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x1614,"(length <= JavascriptArray::MaxArrayLength)",
                                    "length <= JavascriptArray::MaxArrayLength");
        if (!bVar4) {
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar8 = 0;
      }
      recycler = scriptContext->recycler;
      bVar4 = IsFillFromPrototypes(pArr);
      if (bVar4) {
        startIndex = 0;
        if ((length & 1) != 0) {
          FillFromPrototypes(pArr,0,limitIndex);
          startIndex = limitIndex + 1;
        }
        FillFromPrototypes(pArr,startIndex,limitIndex_00);
      }
      if ((pArr->super_ArrayObject).length != length) {
        Throw::FatalInternalError(-0x7fffbffb);
      }
      bVar4 = HasNoMissingValues(pArr);
      if (((bVar4) && (pSVar1 = (pArr->head).ptr, pSVar1 != (SparseArraySegmentBase *)0x0)) &&
         ((pSVar1->next).ptr != (SparseArraySegmentBase *)0x0)) {
        SetHasNoMissingValues(pArr,false);
      }
      failFastOnError._12_4_ = (pArr->super_ArrayObject).length;
      ClearSegmentMap(pArr);
      bVar4 = VarIsImpl<Js::JavascriptNativeIntArray>((RecyclableObject *)pArr);
      if (bVar4) {
        upperValue._0_1_ = false;
      }
      else {
        upperValue._0_1_ = VarIsImpl<Js::JavascriptNativeFloatArray>((RecyclableObject *)pArr);
      }
      local_a0 = (undefined1  [8])scriptContext->threadContext;
      failFastOnError.m_threadContext._0_2_ = 0;
      failFastOnError.m_threadContext._2_1_ = 1;
      pIVar2 = ((ThreadContext *)local_a0)->interruptPoller;
      if (pIVar2 != (InterruptPoller *)0x0) {
        failFastOnError.m_threadContext._0_2_ = (ushort)pIVar2->isDisabled << 8;
        pIVar2->isDisabled = true;
      }
      this = &pArr->head;
      pSVar1 = (pArr->head).ptr;
      if ((pSVar1 != (SparseArraySegmentBase *)0x0) &&
         (((pSVar1->next).ptr != (SparseArraySegmentBase *)0x0 ||
          (pSVar1->length + pSVar1->left < (uint)failFastOnError._12_4_)))) {
        if (bVar4) {
          CopyHeadIfInlinedHeadSegment<int>(pArr,recycler);
          if ((this->ptr->next).ptr != (SparseArraySegmentBase *)0x0) {
            ReallocateNonLeafLastSegmentIfLeaf<int>(pArr,recycler);
          }
        }
        else if (upperValue._0_1_ == false) {
          CopyHeadIfInlinedHeadSegment<void*>(pArr,recycler);
        }
        else {
          CopyHeadIfInlinedHeadSegment<double>(pArr,recycler);
          if ((this->ptr->next).ptr != (SparseArraySegmentBase *)0x0) {
            ReallocateNonLeafLastSegmentIfLeaf<double>(pArr,recycler);
          }
        }
      }
      pSVar1 = this->ptr;
      ptr = (SparseArraySegmentBase *)0x0;
      while (this_00 = pSVar1, this_00 != (SparseArraySegmentBase *)0x0) {
        pSVar1 = (this_00->next).ptr;
        if (this_00->length != 0) {
          if (bVar4) {
            SparseArraySegment<int>::ReverseSegment((SparseArraySegment<int> *)this_00,recycler);
          }
          else if (upperValue._0_1_ == false) {
            SparseArraySegment<void_*>::ReverseSegment
                      ((SparseArraySegment<void_*> *)this_00,recycler);
          }
          else {
            SparseArraySegment<double>::ReverseSegment
                      ((SparseArraySegment<double> *)this_00,recycler);
          }
          uVar10 = this_00->length + this_00->left;
          if ((uint)failFastOnError._12_4_ < uVar10) {
            Throw::FatalInternalError(-0x7fffbffb);
          }
          this_00->left = failFastOnError._12_4_ - uVar10;
          Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::WriteBarrierSet(&this_00->next,ptr);
          SparseArraySegmentBase::EnsureSizeInBound(this_00);
          ptr = this_00;
        }
      }
      Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::WriteBarrierSet(this,ptr);
      if (bVar4) {
        EnsureHeadStartsFromZero<int>(pArr,recycler);
      }
      else if (upperValue._0_1_ == false) {
        EnsureHeadStartsFromZero<void*>(pArr,recycler);
      }
      else {
        EnsureHeadStartsFromZero<double>(pArr,recycler);
      }
      InvalidateLastUsedSegment(pArr);
      ClearSegmentMap(pArr);
      (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
        .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])(pArr);
      failFastOnError.m_threadContext._0_1_ = 1;
      AutoDisableInterrupt::~AutoDisableInterrupt((AutoDisableInterrupt *)local_a0);
      pArr = (JavascriptArray *)obj;
      goto LAB_00a5b0ad;
    }
  }
  if (length >> 0x20 == 0 && typedArrayBase != (TypedArrayBase *)0x0) {
    if ((typedArrayBase->super_ArrayBufferParent).super_ArrayObject.length == length) {
      for (uVar10 = 0; limitIndex_00 = limitIndex_00 - 1, pArr = (JavascriptArray *)obj,
          limitIndex != uVar10; uVar10 = uVar10 + 1) {
        jsReentLock._24_4_ =
             (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
               super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
               _vptr_IRecyclerVisitedObject[0x72])(typedArrayBase,(ulong)uVar10);
        jsReentLock._28_4_ = extraout_var;
        iVar5 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x72])(typedArrayBase,(ulong)limitIndex_00);
        h.m_functionName = (PCWSTR)CONCAT44(extraout_var_00,iVar5);
        (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
          super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0x24])(typedArrayBase,(ulong)uVar10);
        (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
          super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0x24])(typedArrayBase,(ulong)limitIndex_00);
        *(undefined1 *)((long)local_88 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        iVar5 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x70])(typedArrayBase,(ulong)uVar10,h.m_functionName)
        ;
        ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                  ((ThrowTypeErrorOnFailureHelper *)&lowerValue,iVar5);
        iVar5 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x70])
                          (typedArrayBase,(ulong)limitIndex_00,jsReentLock._24_8_);
        ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                  ((ThrowTypeErrorOnFailureHelper *)&lowerValue,iVar5);
        JsReentLock::MutateArrayObject((JsReentLock *)local_88);
        *(bool *)((long)local_88 + 0x108) = true;
      }
    }
    else {
      for (uVar10 = 0; limitIndex_00 = limitIndex_00 - 1, pArr = (JavascriptArray *)obj,
          limitIndex != uVar10; uVar10 = uVar10 + 1) {
        jsReentLock._24_4_ =
             (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
               super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
               _vptr_IRecyclerVisitedObject[0x72])(typedArrayBase,(ulong)uVar10);
        jsReentLock._28_4_ = extraout_var_01;
        iVar5 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x72])(typedArrayBase,(ulong)limitIndex_00);
        h.m_functionName = (PCWSTR)CONCAT44(extraout_var_02,iVar5);
        iVar5 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x24])(typedArrayBase,(ulong)uVar10);
        iVar7 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x24])(typedArrayBase,(ulong)limitIndex_00);
        if (iVar5 == 1) {
          if (iVar7 == 1) {
            *(undefined1 *)((long)local_88 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            iVar5 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.
                      super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x70])
                              (typedArrayBase,(ulong)uVar10,h.m_functionName);
            ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                      ((ThrowTypeErrorOnFailureHelper *)&lowerValue,iVar5);
          }
          else {
            iVar5 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.
                      super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
                      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x2a])
                              (typedArrayBase,(ulong)uVar10,0x400);
            ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                      ((ThrowTypeErrorOnFailureHelper *)&lowerValue,iVar5);
            *(undefined1 *)((long)local_88 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          }
          iVar5 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x70])
                            (typedArrayBase,(ulong)limitIndex_00,jsReentLock._24_8_);
          ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                    ((ThrowTypeErrorOnFailureHelper *)&lowerValue,iVar5);
          JsReentLock::MutateArrayObject((JsReentLock *)local_88);
          *(bool *)((long)local_88 + 0x108) = true;
        }
        else if (iVar7 == 1) {
          *(undefined1 *)((long)local_88 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          iVar5 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x70])
                            (typedArrayBase,(ulong)uVar10,h.m_functionName);
          ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                    ((ThrowTypeErrorOnFailureHelper *)&lowerValue,iVar5);
          JsReentLock::MutateArrayObject((JsReentLock *)local_88);
          *(bool *)((long)local_88 + 0x108) = true;
          iVar5 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x2a])(typedArrayBase,(ulong)limitIndex_00,0x400);
          ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                    ((ThrowTypeErrorOnFailureHelper *)&lowerValue,iVar5);
        }
      }
    }
  }
  else {
    index_00 = length - 1;
    for (index = 0; pArr = (JavascriptArray *)obj, length >> 1 != index; index = index + 1) {
      *(undefined1 *)((long)local_88 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      BVar6 = JavascriptOperators::HasItem(obj,index);
      if (BVar6 == 0) {
        bVar4 = false;
      }
      else {
        BVar6 = JavascriptOperators::GetItem
                          (obj,index,(Var *)&jsReentLock.m_savedNoJsReentrancy,scriptContext);
        bVar4 = BVar6 != 0;
      }
      BVar6 = JavascriptOperators::HasItem(obj,index_00);
      if (BVar6 == 0) {
        bVar11 = false;
      }
      else {
        BVar6 = JavascriptOperators::GetItem(obj,index_00,&h.m_functionName,scriptContext);
        bVar11 = BVar6 != 0;
      }
      JsReentLock::MutateArrayObject((JsReentLock *)local_88);
      *(bool *)((long)local_88 + 0x108) = true;
      if (bVar4) {
        *(undefined1 *)((long)local_88 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        if (bVar11) {
          BVar6 = JavascriptOperators::SetItem
                            (obj,obj,index,h.m_functionName,scriptContext,
                             PropertyOperation_ThrowIfNotExtensible);
          ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                    ((ThrowTypeErrorOnFailureHelper *)&lowerValue,BVar6);
        }
        else {
          BVar6 = JavascriptOperators::DeleteItem
                            (obj,index,PropertyOperation_ThrowOnDeleteIfNotConfig);
          ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                    ((ThrowTypeErrorOnFailureHelper *)&lowerValue,BVar6);
        }
        BVar6 = JavascriptOperators::SetItem
                          (obj,obj,index_00,(Var)jsReentLock._24_8_,scriptContext,
                           PropertyOperation_ThrowIfNotExtensible);
LAB_00a5ac5a:
        ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                  ((ThrowTypeErrorOnFailureHelper *)&lowerValue,BVar6);
        JsReentLock::MutateArrayObject((JsReentLock *)local_88);
        *(bool *)((long)local_88 + 0x108) = true;
      }
      else if (bVar11) {
        *(undefined1 *)((long)local_88 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        BVar6 = JavascriptOperators::SetItem
                          (obj,obj,index,h.m_functionName,scriptContext,
                           PropertyOperation_ThrowIfNotExtensible);
        ThrowTypeErrorOnFailureHelper::ThrowTypeErrorOnFailure
                  ((ThrowTypeErrorOnFailureHelper *)&lowerValue,BVar6);
        BVar6 = JavascriptOperators::DeleteItem
                          (obj,index_00,PropertyOperation_ThrowOnDeleteIfNotConfig);
        goto LAB_00a5ac5a;
      }
      index_00 = index_00 - 1;
    }
  }
LAB_00a5b0ad:
  *(undefined1 *)((long)local_88 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return pArr;
}

Assistant:

Var JavascriptArray::ReverseHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        T middle = length / 2;
        Var lowerValue = nullptr, upperValue = nullptr;
        T lowerExists, upperExists;
        const char16* methodName;
        bool isTypedArrayEntryPoint = typedArrayBase != nullptr;

        if (isTypedArrayEntryPoint)
        {
            methodName = _u("[TypedArray].prototype.reverse");
        }
        else
        {
            methodName = _u("Array.prototype.reverse");
        }

        // If we came from Array.prototype.map and source object is not a JavascriptArray, source could be a TypedArray
        if (!isTypedArrayEntryPoint && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        ThrowTypeErrorOnFailureHelper h(scriptContext, methodName);

        bool useNoSideEffectReverse = pArr != nullptr && !HasAnyES5ArrayInPrototypeChain(pArr);

        if (useNoSideEffectReverse)
        {
            Assert(length <= JavascriptArray::MaxArrayLength);
            Recycler * recycler = scriptContext->GetRecycler();

            if (length <= 1)
            {
                return pArr;
            }

            if (pArr->IsFillFromPrototypes())
            {
                // For odd-length arrays, the middle element is unchanged,
                // so we cannot fill it from the prototypes.
                if (length % 2 == 0)
                {
                    pArr->FillFromPrototypes(0, (uint32)length);
                }
                else
                {
                    middle = length / 2;
                    pArr->FillFromPrototypes(0, (uint32)middle);
                    pArr->FillFromPrototypes(1 + (uint32)middle, (uint32)length);
                }
            }

            // As we have already established that the FillFromPrototype should not change the bound of the array.
            if (length != (T)pArr->length)
            {
                Js::Throw::FatalInternalError();
            }

            if (pArr->HasNoMissingValues() && pArr->head && pArr->head->next)
            {
                // This function currently does not track missing values in the head segment if there are multiple segments
                pArr->SetHasNoMissingValues(false);
            }

            // Above FillFromPrototypes call can change the length of the array. Our segment calculation below will
            // not work with the stale length. Update the length.
            // Note : since we are reversing the whole segment below - the functionality is not spec compliant already.
            length = pArr->length;

            SparseArraySegmentBase *prevSeg = nullptr;
            SparseArraySegmentBase *nextSeg = nullptr;

            bool isIntArray = false;
            bool isFloatArray = false;

            pArr->ClearSegmentMap(); // Just dump the segment map on reverse

            if (VarIs<JavascriptNativeIntArray>(pArr))
            {
                isIntArray = true;
            }
            else if (VarIs<JavascriptNativeFloatArray>(pArr))
            {
                isFloatArray = true;
            }

            // Code below has potential to throw due to OOM or SO. Just FailFast on those cases
            AutoDisableInterrupt failFastOnError(scriptContext->GetThreadContext());

            // During the loop below we are going to reverse the segments list. The head segment will become the last segment.
            // We have to verify that the current head segment is not the inilined segement, otherwise due to shuffling below (of EnsureHeadStartsFromZero call below), the inlined segment will no longer
            // be the head and that can create issue down the line. Create new segment if it is an inilined segment.
            if (pArr->head && (pArr->head->next || (pArr->head->left + pArr->head->length) < length))
            {
                if (isIntArray)
                {
                    CopyHeadIfInlinedHeadSegment<int32>(pArr, recycler);
                    if (pArr->head->next)
                    {
                        ReallocateNonLeafLastSegmentIfLeaf<int32>(pArr, recycler);
                    }
                }
                else if (isFloatArray)
                {
                    CopyHeadIfInlinedHeadSegment<double>(pArr, recycler);
                    if (pArr->head->next)
                    {
                        ReallocateNonLeafLastSegmentIfLeaf<double>(pArr, recycler);
                    }
                }
                else
                {
                    CopyHeadIfInlinedHeadSegment<Var>(pArr, recycler);
                }
            }

            SparseArraySegmentBase* seg = pArr->head;

            while (seg)
            {
                nextSeg = seg->next;

                // If seg.length == 0, it is possible that (seg.left + seg.length == prev.left + prev.length),
                // resulting in 2 segments sharing the same "left".
                if (seg->length > 0)
                {
                    if (isIntArray)
                    {
                        ((SparseArraySegment<int32>*)seg)->ReverseSegment(recycler);
                    }
                    else if (isFloatArray)
                    {
                        ((SparseArraySegment<double>*)seg)->ReverseSegment(recycler);
                    }
                    else
                    {
                        ((SparseArraySegment<Var>*)seg)->ReverseSegment(recycler);
                    }

                    if (((uint32)length) < (seg->left + seg->length))
                    {
                        Js::Throw::FatalInternalError();
                    }
                    seg->left = ((uint32)length) - (seg->left + seg->length);

                    seg->next = prevSeg;
                    // Make sure size doesn't overlap with next segment.
                    // An easy fix is to just truncate the size...
                    seg->EnsureSizeInBound();

                    prevSeg = seg;
                }

                seg = nextSeg;
            }

            pArr->head = prevSeg;

            if (isIntArray)
            {
                pArr->EnsureHeadStartsFromZero<int32>(recycler);
            }
            else if (isFloatArray)
            {
                pArr->EnsureHeadStartsFromZero<double>(recycler);
            }
            else
            {
                pArr->EnsureHeadStartsFromZero<Var>(recycler);
            }

            pArr->InvalidateLastUsedSegment(); // lastUsedSegment might be 0-length and discarded above
            pArr->ClearSegmentMap();
#ifdef VALIDATE_ARRAY
            pArr->ValidateArray();
#endif

            failFastOnError.Completed();
        }
        else if (typedArrayBase && length <= JavascriptArray::MaxArrayLength)
        {
            if (typedArrayBase->GetLength() == length)
            {
                // If typedArrayBase->length == length then we know that the TypedArray will have all items < length
                // and we won't have to check that the elements exist or not.
                for (uint32 lower = 0; lower < (uint32)middle; lower++)
                {
                    uint32 upper = (uint32)length - lower - 1;

                    lowerValue = typedArrayBase->DirectGetItem(lower);
                    upperValue = typedArrayBase->DirectGetItem(upper);

                    // We still have to call HasItem even though we know the TypedArray has both lower and upper because
                    // there may be a proxy handler trapping HasProperty.
                    lowerExists = typedArrayBase->HasItem(lower);
                    upperExists = typedArrayBase->HasItem(upper);

                    JS_REENTRANT(jsReentLock,
                        h.ThrowTypeErrorOnFailure(typedArrayBase->DirectSetItem(lower, upperValue)),
                        h.ThrowTypeErrorOnFailure(typedArrayBase->DirectSetItem(upper, lowerValue)));
                }
            }
            else
            {
                Assert(middle <= UINT_MAX);
                for (uint32 lower = 0; lower < (uint32)middle; lower++)
                {
                    uint32 upper = (uint32)length - lower - 1;

                    lowerValue = typedArrayBase->DirectGetItem(lower);
                    upperValue = typedArrayBase->DirectGetItem(upper);

                    lowerExists = typedArrayBase->HasItem(lower);
                    upperExists = typedArrayBase->HasItem(upper);

                    if (lowerExists)
                    {
                        if (upperExists)
                        {
                            JS_REENTRANT(jsReentLock,
                                h.ThrowTypeErrorOnFailure(typedArrayBase->DirectSetItem(lower, upperValue)),
                                h.ThrowTypeErrorOnFailure(typedArrayBase->DirectSetItem(upper, lowerValue)));
                        }
                        else
                        {
                            // This will always fail for a TypedArray if lower < length
                            h.ThrowTypeErrorOnFailure(typedArrayBase->DeleteItem(lower, PropertyOperation_ThrowOnDeleteIfNotConfig));
                            JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(typedArrayBase->DirectSetItem(upper, lowerValue)));
                        }
                    }
                    else
                    {
                        if (upperExists)
                        {
                            JS_REENTRANT(jsReentLock, h.ThrowTypeErrorOnFailure(typedArrayBase->DirectSetItem(lower, upperValue)));
                            // This will always fail for a TypedArray if upper < length
                            h.ThrowTypeErrorOnFailure(typedArrayBase->DeleteItem(upper, PropertyOperation_ThrowOnDeleteIfNotConfig));
                        }
                    }
                }
            }
        }
        else
        {
            for (T lower = 0; lower < middle; lower++)
            {
                T upper = length - lower - 1;

                JS_REENTRANT(jsReentLock,
                    lowerExists = JavascriptOperators::HasItem(obj, lower) && JavascriptOperators::GetItem(obj, lower, &lowerValue, scriptContext),
                    upperExists = JavascriptOperators::HasItem(obj, upper) && JavascriptOperators::GetItem(obj, upper, &upperValue, scriptContext));

                if (lowerExists)
                {
                    if (upperExists)
                    {
                        JS_REENTRANT(jsReentLock,
                            h.ThrowTypeErrorOnFailure(JavascriptOperators::SetItem(obj, obj, lower, upperValue, scriptContext, PropertyOperation_ThrowIfNotExtensible)),
                            h.ThrowTypeErrorOnFailure(JavascriptOperators::SetItem(obj, obj, upper, lowerValue, scriptContext, PropertyOperation_ThrowIfNotExtensible)));
                    }
                    else
                    {
                        JS_REENTRANT(jsReentLock,
                            h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(obj, lower, PropertyOperation_ThrowOnDeleteIfNotConfig)),
                            h.ThrowTypeErrorOnFailure(JavascriptOperators::SetItem(obj, obj, upper, lowerValue, scriptContext, PropertyOperation_ThrowIfNotExtensible)));
                    }
                }
                else
                {
                    if (upperExists)
                    {
                        JS_REENTRANT(jsReentLock,
                            h.ThrowTypeErrorOnFailure(JavascriptOperators::SetItem(obj, obj, lower, upperValue, scriptContext, PropertyOperation_ThrowIfNotExtensible)),
                            h.ThrowTypeErrorOnFailure(JavascriptOperators::DeleteItem(obj, upper, PropertyOperation_ThrowOnDeleteIfNotConfig)));
                    }
                }
            }
        }

        return obj;
    }